

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers_tests.cpp
# Opt level: O0

void __thiscall
iu_PrintToTest_x_iutest_x_Variant_Test::iu_PrintToTest_x_iutest_x_Variant_Test
          (iu_PrintToTest_x_iutest_x_Variant_Test *this)

{
  iu_PrintToTest_x_iutest_x_Variant_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_PrintToTest_x_iutest_x_Variant_Test_001ce6f8;
  return;
}

Assistant:

IUTEST(PrintToTest, Variant)
{
    {
        PrintToLogChecker ck("1234");
        ::std::variant<int, float, ::std::string> v = 1234;
        IUTEST_PRINTTOSTRING_EQ(ck, v);
        IUTEST_STREAMOUT_CHECK(v);
    }
    {
        PrintToLogChecker ck("test");
        ::std::variant<int, float, ::std::string> v("test");
        IUTEST_PRINTTOSTRING_EQ(ck, v);
        IUTEST_STREAMOUT_CHECK(v);
    }
    {
        PrintToLogChecker ck("monostate");
        ::std::variant<std::monostate, int, float, std::string> v;
        IUTEST_PRINTTOSTRING_EQ(ck, v);
        IUTEST_STREAMOUT_CHECK(v);
    }
#if IUTEST_HAS_EXCEPTIONS && !defined(IUTEST_USE_GTEST)
    {
        // gtest no support variant valueless
        PrintToLogChecker ck("valueless_by_exception");
        ::std::variant<int, float, AlwaysThrow> v = 0.2f;
        try
        {
            struct S { operator int() { throw 42; } };
            v.emplace<0>(S());
        }
        catch(...)
        {
            IUTEST_INFORM_TRUE(v.valueless_by_exception());
        }
        if( !v.valueless_by_exception() )
        {
            try
            {
                v = AlwaysThrow();
            }
            catch(...)
            {
                IUTEST_INFORM_TRUE(v.valueless_by_exception());
            }
        }

        IUTEST_PRINTTOSTRING_EQ(ck, v);
        IUTEST_STREAMOUT_CHECK(v);
    }
#endif
}